

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Number.h
# Opt level: O2

void __thiscall Num::~Num(Num *this)

{
  token::Token::~Token(&this->super_Token);
  operator_delete(this,0x38);
  return;
}

Assistant:

~Num(){}